

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O1

bool Map_InsertObject(PCASC_MAP pMap,void *pvNewObject,void *pvKey)

{
  ulong uVar1;
  size_t __n;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  LPBYTE pbKey;
  
  if (pMap == (PCASC_MAP)0x0) {
    return false;
  }
  uVar1 = pMap->TableSize;
  uVar6 = pMap->ItemCount + 1;
  if (uVar6 < uVar1) {
    __n = pMap->KeyLength;
    if (__n == 0) {
      uVar7 = 0x7eee7eee;
    }
    else {
      uVar4 = 0x7eee7eee;
      uVar7 = 0;
      do {
        uVar4 = uVar4 ^ uVar4 << 5 ^ uVar4 >> 0x18 ^ (uint)*(byte *)((long)pvKey + uVar7);
        uVar7 = uVar7 + 1;
      } while ((uVar7 & 0xffffffff) < __n);
      uVar7 = (ulong)uVar4;
    }
    uVar7 = uVar7 % uVar1;
    pvVar8 = pMap->HashTable[uVar7];
    if (pvVar8 != (void *)0x0) {
      sVar2 = pMap->KeyOffset;
      do {
        iVar5 = bcmp((void *)((long)pvVar8 + sVar2),pvKey,__n);
        if (iVar5 == 0) goto LAB_0010fbfb;
        uVar7 = (ulong)((int)uVar7 + 1) % uVar1;
        pvVar8 = pMap->HashTable[uVar7];
      } while (pvVar8 != (void *)0x0);
    }
    pMap->HashTable[uVar7] = pvNewObject;
    pMap->ItemCount = uVar6;
    bVar3 = true;
  }
  else {
LAB_0010fbfb:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Map_InsertObject(PCASC_MAP pMap, void * pvNewObject, void * pvKey)
{
    void * pvExistingObject;
    DWORD dwHashIndex;

    // Verify pointer to the map
    if(pMap != NULL)
    {
        // Limit check
        if((pMap->ItemCount + 1) >= pMap->TableSize)
            return false;

        // Construct the hash index
        dwHashIndex = CalcHashIndex_Key(pMap, pvKey);
        while(pMap->HashTable[dwHashIndex] != NULL)
        {
            // Get the pointer at that position
            pvExistingObject = pMap->HashTable[dwHashIndex];

            // Check if hash being inserted conflicts with an existing hash
            if(CompareObject_Key(pMap, pvExistingObject, pvKey))
                return false;

            // Move to the next entry
            dwHashIndex = (dwHashIndex + 1) % pMap->TableSize;
        }

        // Insert at that position
        pMap->HashTable[dwHashIndex] = pvNewObject;
        pMap->ItemCount++;
        return true;
    }

    // Failed
    return false;
}